

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O2

Solution * Genetic::generate_child(Solution *p1,Solution *p2)

{
  bool bVar1;
  int iVar2;
  Solution *this;
  Vehicle *pVVar3;
  difference_type __d;
  Solution *pSVar4;
  _List_node_base **pp_Var5;
  _List_node_base *p_Var6;
  Vehicle *nv;
  Vehicle *vehicle;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  int ec;
  iterator it;
  list<Vehicle_*,_std::allocator<Vehicle_*>_> vehicle_pool;
  
  this = (Solution *)operator_new(0x20);
  (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node._M_size =
       0;
  vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node._M_size = 0;
  pSVar4 = p1;
  vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&vehicle_pool;
  vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&vehicle_pool;
  while (pSVar4 = (Solution *)
                  (pSVar4->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl
                  ._M_node.super__List_node_base._M_next, pSVar4 != p1) {
    vehicle = (Vehicle *)
              (pSVar4->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
              _M_node._M_size;
    std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back(&vehicle_pool,&vehicle);
  }
  pSVar4 = p2;
  while (pSVar4 = (Solution *)
                  (pSVar4->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl
                  ._M_node.super__List_node_base._M_next, pSVar4 != p2) {
    vehicle = (Vehicle *)
              (pSVar4->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
              _M_node._M_size;
    std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back(&vehicle_pool,&vehicle);
  }
  while (vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&vehicle_pool) {
    it._M_node = vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                 _M_node.super__List_node_base._M_next;
    iVar2 = rand();
    std::__advance<std::_List_iterator<Vehicle*>,long>
              (&it,(ulong)(long)iVar2 %
                   vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                   _M_node._M_size);
    p_Var6 = it._M_node[1]._M_next;
    std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::erase
              (&vehicle_pool,(const_iterator)it._M_node);
    pVVar3 = (Vehicle *)operator_new(0x28);
    Vehicle::Vehicle(pVVar3,this);
    nv = pVVar3;
    std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back
              ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)this,&nv);
    pp_Var5 = &p_Var6->_M_prev;
    iVar2 = 0;
    p_Var6 = (_List_node_base *)pp_Var5;
    while (p_Var6 = p_Var6->_M_next, p_Var6 != (_List_node_base *)pp_Var5) {
      std::__shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2> *)&vehicle,
                 (__shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2> *)(p_Var6 + 1));
      bVar1 = Solution::has_node(this,*(Point **)vehicle);
      if (!bVar1) {
        ec = 0;
        Vehicle::add_node(nv,*(Point **)vehicle,iVar2,&ec);
        iVar2 = iVar2 + 1;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    }
    if ((nv->nodes).
        super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
        ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nv->nodes) {
      std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::remove
                ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)this,(char *)&nv);
      pVVar3 = nv;
      if (nv != (Vehicle *)0x0) {
        std::__cxx11::
        _List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::
        _M_clear(&(nv->nodes).
                  super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                );
      }
      operator_delete(pVVar3);
    }
  }
  Solution::total_weight(this);
  std::__cxx11::_List_base<Vehicle_*,_std::allocator<Vehicle_*>_>::_M_clear
            (&vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>);
  return this;
}

Assistant:

Solution* Genetic::generate_child(Solution* p1, Solution* p2)
{
	auto solution = new Solution;
	//Route-Based Crossover
	std::list<Vehicle*> vehicle_pool;
	for (auto vehicle : p1->vehicles)
	{
		vehicle_pool.push_back(vehicle);
	}
	for (auto vehicle : p2->vehicles)
	{
		vehicle_pool.push_back(vehicle);
	}

	auto total_nodes = Utils::raw_rows.size() - 1;

	while (!vehicle_pool.empty())
	{
		auto it = vehicle_pool.begin();
		std::advance(it, rand() % vehicle_pool.size());
		auto pool = *it;
		vehicle_pool.erase(it);

		auto nv = new Vehicle(solution);
		solution->vehicles.push_back(nv);
		auto pos = 0;
		for (auto node : pool->nodes)
		{
			if (!solution->has_node(node->p))
			{
				auto ec = 0;
				nv->add_node(node->p, pos++, ec);
				total_nodes--;
			}
		}
		if (nv->nodes.empty())
		{
			solution->vehicles.remove(nv);
			delete nv;
		}
	}

	solution->total_weight();
	return solution;
}